

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O0

void highbd_blend_a64_d16_mask_w16_sse4_1
               (uint16_t *dst,CONV_BUF_TYPE *src0,CONV_BUF_TYPE *src1,__m128i *round_offset,
               int shift,__m128i *mask0l,__m128i *mask0h,__m128i *clip_low,__m128i *clip_high,
               __m128i *mask_max)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined8 *in_RCX;
  void *in_RDX;
  longlong extraout_RDX;
  void *in_RSI;
  void *pvVar27;
  void *in_RDI;
  uint in_R8D;
  undefined1 (*in_R9) [16];
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  __m128i alVar32;
  __m128i v;
  __m128i clipl;
  __m128i cliph;
  __m128i packl;
  __m128i packh;
  __m128i resll;
  __m128i reslh;
  __m128i reshl;
  __m128i reshh;
  __m128i mulll;
  __m128i mullh;
  __m128i mul3l;
  __m128i mul3h;
  __m128i mul3_lows;
  __m128i mul3_highs;
  __m128i mul2l;
  __m128i mul2h;
  __m128i mul2_lows;
  __m128i mul2_highs;
  __m128i mulhl;
  __m128i mulhh;
  __m128i mul1l;
  __m128i mul1h;
  __m128i mul1_lows;
  __m128i mul1_highs;
  __m128i mul0l;
  __m128i mul0h;
  __m128i mul0_lows;
  __m128i mul0_highs;
  __m128i mask1l;
  __m128i mask1h;
  __m128i s1h;
  __m128i s1l;
  __m128i s0h;
  __m128i s0l;
  short local_488;
  short sStack_486;
  short sStack_484;
  short sStack_482;
  short sStack_480;
  short sStack_47e;
  short sStack_47c;
  short sStack_47a;
  short local_478;
  short sStack_476;
  short sStack_474;
  short sStack_472;
  short sStack_470;
  short sStack_46e;
  short sStack_46c;
  short sStack_46a;
  short local_468;
  short sStack_466;
  short sStack_464;
  short sStack_462;
  short sStack_460;
  short sStack_45e;
  short sStack_45c;
  short sStack_45a;
  short local_458;
  short sStack_456;
  short sStack_454;
  short sStack_452;
  short sStack_450;
  short sStack_44e;
  short sStack_44c;
  short sStack_44a;
  short local_448;
  short sStack_446;
  short sStack_444;
  short sStack_442;
  short sStack_440;
  short sStack_43e;
  short sStack_43c;
  short sStack_43a;
  short local_428;
  short sStack_426;
  short sStack_424;
  short sStack_422;
  short sStack_420;
  short sStack_41e;
  short sStack_41c;
  short sStack_41a;
  short local_418;
  short sStack_416;
  short sStack_414;
  short sStack_412;
  short sStack_410;
  short sStack_40e;
  short sStack_40c;
  short sStack_40a;
  short local_408;
  short sStack_406;
  short sStack_404;
  short sStack_402;
  short sStack_400;
  short sStack_3fe;
  short sStack_3fc;
  short sStack_3fa;
  short local_3e8;
  short sStack_3e6;
  short sStack_3e4;
  short sStack_3e2;
  short sStack_3e0;
  short sStack_3de;
  short sStack_3dc;
  short sStack_3da;
  short local_3d8;
  short sStack_3d6;
  short sStack_3d4;
  short sStack_3d2;
  short sStack_3d0;
  short sStack_3ce;
  short sStack_3cc;
  short sStack_3ca;
  undefined2 local_3c8;
  undefined2 uStack_3c6;
  undefined2 uStack_3c4;
  undefined2 uStack_3c2;
  undefined2 local_3a8;
  undefined2 uStack_3a6;
  undefined2 uStack_3a4;
  undefined2 uStack_3a2;
  undefined2 local_388;
  undefined2 uStack_386;
  undefined2 uStack_384;
  undefined2 uStack_382;
  undefined2 local_368;
  undefined2 uStack_366;
  undefined2 uStack_364;
  undefined2 uStack_362;
  undefined2 uStack_340;
  undefined2 uStack_33e;
  undefined2 uStack_33c;
  undefined2 uStack_33a;
  undefined2 uStack_320;
  undefined2 uStack_31e;
  undefined2 uStack_31c;
  undefined2 uStack_31a;
  undefined2 uStack_300;
  undefined2 uStack_2fe;
  undefined2 uStack_2fc;
  undefined2 uStack_2fa;
  undefined2 uStack_2e0;
  undefined2 uStack_2de;
  undefined2 uStack_2dc;
  undefined2 uStack_2da;
  int local_288;
  int iStack_284;
  int iStack_280;
  int iStack_27c;
  int local_268;
  int iStack_264;
  int iStack_260;
  int iStack_25c;
  int local_248;
  int iStack_244;
  int iStack_240;
  int iStack_23c;
  int local_228;
  int iStack_224;
  int iStack_220;
  int iStack_21c;
  int iStack_104;
  int iStack_fc;
  int iStack_f4;
  int iStack_ec;
  int iStack_e4;
  int iStack_dc;
  int iStack_d4;
  int iStack_cc;
  int iStack_c4;
  int iStack_bc;
  int iStack_b4;
  int iStack_ac;
  int iStack_a4;
  int iStack_9c;
  int iStack_94;
  int iStack_8c;
  
  pvVar27 = in_RSI;
  xx_loadu_128(in_RSI);
  xx_loadu_128((void *)((long)in_RSI + 0x10));
  xx_loadu_128(in_RDX);
  alVar32 = xx_loadu_128((void *)((long)in_RDX + 0x10));
  uVar1 = *(undefined8 *)packl[0];
  uVar2 = *(undefined8 *)(packl[0] + 8);
  uVar3 = *(undefined8 *)clipl[1];
  uVar4 = *(undefined8 *)(clipl[1] + 8);
  local_458 = (short)uVar1;
  sStack_456 = (short)((ulong)uVar1 >> 0x10);
  sStack_454 = (short)((ulong)uVar1 >> 0x20);
  sStack_452 = (short)((ulong)uVar1 >> 0x30);
  sStack_450 = (short)uVar2;
  sStack_44e = (short)((ulong)uVar2 >> 0x10);
  sStack_44c = (short)((ulong)uVar2 >> 0x20);
  sStack_44a = (short)((ulong)uVar2 >> 0x30);
  local_468 = (short)uVar3;
  sStack_466 = (short)((ulong)uVar3 >> 0x10);
  sStack_464 = (short)((ulong)uVar3 >> 0x20);
  sStack_462 = (short)((ulong)uVar3 >> 0x30);
  sStack_460 = (short)uVar4;
  sStack_45e = (short)((ulong)uVar4 >> 0x10);
  sStack_45c = (short)((ulong)uVar4 >> 0x20);
  sStack_45a = (short)((ulong)uVar4 >> 0x30);
  uVar1 = *(undefined8 *)packl[0];
  uVar2 = *(undefined8 *)(packl[0] + 8);
  uVar3 = *(undefined8 *)*in_R9;
  uVar4 = *(undefined8 *)(*in_R9 + 8);
  local_478 = (short)uVar1;
  sStack_476 = (short)((ulong)uVar1 >> 0x10);
  sStack_474 = (short)((ulong)uVar1 >> 0x20);
  sStack_472 = (short)((ulong)uVar1 >> 0x30);
  sStack_470 = (short)uVar2;
  sStack_46e = (short)((ulong)uVar2 >> 0x10);
  sStack_46c = (short)((ulong)uVar2 >> 0x20);
  sStack_46a = (short)((ulong)uVar2 >> 0x30);
  local_488 = (short)uVar3;
  sStack_486 = (short)((ulong)uVar3 >> 0x10);
  sStack_484 = (short)((ulong)uVar3 >> 0x20);
  sStack_482 = (short)((ulong)uVar3 >> 0x30);
  sStack_480 = (short)uVar4;
  sStack_47e = (short)((ulong)uVar4 >> 0x10);
  sStack_47c = (short)((ulong)uVar4 >> 0x20);
  sStack_47a = (short)((ulong)uVar4 >> 0x30);
  auVar26._8_8_ = extraout_XMM0_Qb_00;
  auVar26._0_8_ = extraout_XMM0_Qa_00;
  auVar28 = pmulhuw(*(undefined1 (*) [16])clipl[1],auVar26);
  uVar1 = *(undefined8 *)clipl[1];
  uVar2 = *(undefined8 *)(clipl[1] + 8);
  local_3d8 = (short)uVar1;
  sStack_3d6 = (short)((ulong)uVar1 >> 0x10);
  sStack_3d4 = (short)((ulong)uVar1 >> 0x20);
  sStack_3d2 = (short)((ulong)uVar1 >> 0x30);
  sStack_3d0 = (short)uVar2;
  sStack_3ce = (short)((ulong)uVar2 >> 0x10);
  sStack_3cc = (short)((ulong)uVar2 >> 0x20);
  sStack_3ca = (short)((ulong)uVar2 >> 0x30);
  local_3e8 = (short)extraout_XMM0_Qa_00;
  sStack_3e6 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x10);
  sStack_3e4 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x20);
  sStack_3e2 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x30);
  sStack_3e0 = (short)extraout_XMM0_Qb_00;
  sStack_3de = (short)((ulong)extraout_XMM0_Qb_00 >> 0x10);
  sStack_3dc = (short)((ulong)extraout_XMM0_Qb_00 >> 0x20);
  sStack_3da = (short)((ulong)extraout_XMM0_Qb_00 >> 0x30);
  uStack_2e0 = auVar28._8_2_;
  uStack_2de = auVar28._10_2_;
  uStack_2dc = auVar28._12_2_;
  uStack_2da = auVar28._14_2_;
  local_368 = auVar28._0_2_;
  uStack_366 = auVar28._2_2_;
  uStack_364 = auVar28._4_2_;
  uStack_362 = auVar28._6_2_;
  auVar25._2_2_ = sStack_456 - sStack_466;
  auVar25._0_2_ = local_458 - local_468;
  auVar25._4_2_ = sStack_454 - sStack_464;
  auVar25._6_2_ = sStack_452 - sStack_462;
  auVar25._10_2_ = sStack_44e - sStack_45e;
  auVar25._8_2_ = sStack_450 - sStack_460;
  auVar25._12_2_ = sStack_44c - sStack_45c;
  auVar25._14_2_ = sStack_44a - sStack_45a;
  auVar24._8_8_ = extraout_XMM0_Qb_02;
  auVar24._0_8_ = extraout_XMM0_Qa_02;
  auVar28 = pmulhuw(auVar25,auVar24);
  local_408 = (short)extraout_XMM0_Qa_02;
  sStack_406 = (short)((ulong)extraout_XMM0_Qa_02 >> 0x10);
  sStack_404 = (short)((ulong)extraout_XMM0_Qa_02 >> 0x20);
  sStack_402 = (short)((ulong)extraout_XMM0_Qa_02 >> 0x30);
  sStack_400 = (short)extraout_XMM0_Qb_02;
  sStack_3fe = (short)((ulong)extraout_XMM0_Qb_02 >> 0x10);
  sStack_3fc = (short)((ulong)extraout_XMM0_Qb_02 >> 0x20);
  sStack_3fa = (short)((ulong)extraout_XMM0_Qb_02 >> 0x30);
  uStack_300 = auVar28._8_2_;
  uStack_2fe = auVar28._10_2_;
  uStack_2fc = auVar28._12_2_;
  uStack_2fa = auVar28._14_2_;
  local_388 = auVar28._0_2_;
  uStack_386 = auVar28._2_2_;
  uStack_384 = auVar28._4_2_;
  uStack_382 = auVar28._6_2_;
  iVar19 = CONCAT22(uStack_2e0,sStack_3d0 * sStack_3e0);
  iVar20 = CONCAT22(uStack_2dc,sStack_3cc * sStack_3dc);
  iVar15 = CONCAT22(uStack_300,(sStack_450 - sStack_460) * sStack_400);
  iVar16 = CONCAT22(uStack_2fc,(sStack_44c - sStack_45c) * sStack_3fc);
  iStack_94 = (int)(CONCAT26(uStack_2de,CONCAT24(sStack_3ce * sStack_3de,iVar19)) >> 0x20);
  iStack_8c = (int)(CONCAT26(uStack_2da,CONCAT24(sStack_3ca * sStack_3da,iVar20)) >> 0x20);
  iStack_a4 = (int)(CONCAT26(uStack_2fe,CONCAT24((sStack_44e - sStack_45e) * sStack_3fe,iVar15)) >>
                   0x20);
  iStack_9c = (int)(CONCAT26(uStack_2fa,CONCAT24((sStack_44a - sStack_45a) * sStack_3fa,iVar16)) >>
                   0x20);
  iVar17 = CONCAT22(local_368,local_3d8 * local_3e8);
  iVar18 = CONCAT22(uStack_364,sStack_3d4 * sStack_3e4);
  iVar13 = CONCAT22(local_388,(local_458 - local_468) * local_408);
  iVar14 = CONCAT22(uStack_384,(sStack_454 - sStack_464) * sStack_404);
  iStack_b4 = (int)(CONCAT26(uStack_366,CONCAT24(sStack_3d6 * sStack_3e6,iVar17)) >> 0x20);
  iStack_ac = (int)(CONCAT26(uStack_362,CONCAT24(sStack_3d2 * sStack_3e2,iVar18)) >> 0x20);
  iStack_c4 = (int)(CONCAT26(uStack_386,CONCAT24((sStack_456 - sStack_466) * sStack_406,iVar13)) >>
                   0x20);
  iStack_bc = (int)(CONCAT26(uStack_382,CONCAT24((sStack_452 - sStack_462) * sStack_402,iVar14)) >>
                   0x20);
  auVar23._8_8_ = extraout_XMM0_Qb;
  auVar23._0_8_ = extraout_XMM0_Qa;
  auVar28 = pmulhuw(*in_R9,auVar23);
  uVar1 = *(undefined8 *)*in_R9;
  uVar2 = *(undefined8 *)(*in_R9 + 8);
  local_418 = (short)uVar1;
  sStack_416 = (short)((ulong)uVar1 >> 0x10);
  sStack_414 = (short)((ulong)uVar1 >> 0x20);
  sStack_412 = (short)((ulong)uVar1 >> 0x30);
  sStack_410 = (short)uVar2;
  sStack_40e = (short)((ulong)uVar2 >> 0x10);
  sStack_40c = (short)((ulong)uVar2 >> 0x20);
  sStack_40a = (short)((ulong)uVar2 >> 0x30);
  local_428 = (short)extraout_XMM0_Qa;
  sStack_426 = (short)((ulong)extraout_XMM0_Qa >> 0x10);
  sStack_424 = (short)((ulong)extraout_XMM0_Qa >> 0x20);
  sStack_422 = (short)((ulong)extraout_XMM0_Qa >> 0x30);
  sStack_420 = (short)extraout_XMM0_Qb;
  sStack_41e = (short)((ulong)extraout_XMM0_Qb >> 0x10);
  sStack_41c = (short)((ulong)extraout_XMM0_Qb >> 0x20);
  sStack_41a = (short)((ulong)extraout_XMM0_Qb >> 0x30);
  uStack_320 = auVar28._8_2_;
  uStack_31e = auVar28._10_2_;
  uStack_31c = auVar28._12_2_;
  uStack_31a = auVar28._14_2_;
  local_3a8 = auVar28._0_2_;
  uStack_3a6 = auVar28._2_2_;
  uStack_3a4 = auVar28._4_2_;
  uStack_3a2 = auVar28._6_2_;
  auVar31._2_2_ = sStack_476 - sStack_486;
  auVar31._0_2_ = local_478 - local_488;
  auVar31._4_2_ = sStack_474 - sStack_484;
  auVar31._6_2_ = sStack_472 - sStack_482;
  auVar31._10_2_ = sStack_46e - sStack_47e;
  auVar31._8_2_ = sStack_470 - sStack_480;
  auVar31._12_2_ = sStack_46c - sStack_47c;
  auVar31._14_2_ = sStack_46a - sStack_47a;
  auVar30._8_8_ = extraout_XMM0_Qb_01;
  auVar30._0_8_ = extraout_XMM0_Qa_01;
  auVar28 = pmulhuw(auVar31,auVar30);
  local_448 = (short)extraout_XMM0_Qa_01;
  sStack_446 = (short)((ulong)extraout_XMM0_Qa_01 >> 0x10);
  sStack_444 = (short)((ulong)extraout_XMM0_Qa_01 >> 0x20);
  sStack_442 = (short)((ulong)extraout_XMM0_Qa_01 >> 0x30);
  sStack_440 = (short)extraout_XMM0_Qb_01;
  sStack_43e = (short)((ulong)extraout_XMM0_Qb_01 >> 0x10);
  sStack_43c = (short)((ulong)extraout_XMM0_Qb_01 >> 0x20);
  sStack_43a = (short)((ulong)extraout_XMM0_Qb_01 >> 0x30);
  uStack_340 = auVar28._8_2_;
  uStack_33e = auVar28._10_2_;
  uStack_33c = auVar28._12_2_;
  uStack_33a = auVar28._14_2_;
  local_3c8 = auVar28._0_2_;
  uStack_3c6 = auVar28._2_2_;
  uStack_3c4 = auVar28._4_2_;
  uStack_3c2 = auVar28._6_2_;
  iVar11 = CONCAT22(uStack_320,sStack_410 * sStack_420);
  iVar12 = CONCAT22(uStack_31c,sStack_40c * sStack_41c);
  iVar7 = CONCAT22(uStack_340,(sStack_470 - sStack_480) * sStack_440);
  iVar8 = CONCAT22(uStack_33c,(sStack_46c - sStack_47c) * sStack_43c);
  iStack_d4 = (int)(CONCAT26(uStack_31e,CONCAT24(sStack_40e * sStack_41e,iVar11)) >> 0x20);
  iStack_cc = (int)(CONCAT26(uStack_31a,CONCAT24(sStack_40a * sStack_41a,iVar12)) >> 0x20);
  iStack_e4 = (int)(CONCAT26(uStack_33e,CONCAT24((sStack_46e - sStack_47e) * sStack_43e,iVar7)) >>
                   0x20);
  iStack_dc = (int)(CONCAT26(uStack_33a,CONCAT24((sStack_46a - sStack_47a) * sStack_43a,iVar8)) >>
                   0x20);
  iVar9 = CONCAT22(local_3a8,local_418 * local_428);
  iVar10 = CONCAT22(uStack_3a4,sStack_414 * sStack_424);
  iVar5 = CONCAT22(local_3c8,(local_478 - local_488) * local_448);
  iVar6 = CONCAT22(uStack_3c4,(sStack_474 - sStack_484) * sStack_444);
  iStack_f4 = (int)(CONCAT26(uStack_3a6,CONCAT24(sStack_416 * sStack_426,iVar9)) >> 0x20);
  iStack_ec = (int)(CONCAT26(uStack_3a2,CONCAT24(sStack_412 * sStack_422,iVar10)) >> 0x20);
  iStack_104 = (int)(CONCAT26(uStack_3c6,CONCAT24((sStack_476 - sStack_486) * sStack_446,iVar5)) >>
                    0x20);
  iStack_fc = (int)(CONCAT26(uStack_3c2,CONCAT24((sStack_472 - sStack_482) * sStack_442,iVar6)) >>
                   0x20);
  local_228 = (int)*in_RCX;
  iStack_224 = (int)((ulong)*in_RCX >> 0x20);
  iStack_220 = (int)in_RCX[1];
  iStack_21c = (int)((ulong)in_RCX[1] >> 0x20);
  auVar28 = ZEXT416(in_R8D);
  local_248 = (int)*in_RCX;
  iStack_244 = (int)((ulong)*in_RCX >> 0x20);
  iStack_240 = (int)in_RCX[1];
  iStack_23c = (int)((ulong)in_RCX[1] >> 0x20);
  auVar29 = ZEXT416(in_R8D);
  local_268 = (int)*in_RCX;
  iStack_264 = (int)((ulong)*in_RCX >> 0x20);
  iStack_260 = (int)in_RCX[1];
  iStack_25c = (int)((ulong)in_RCX[1] >> 0x20);
  auVar30 = ZEXT416(in_R8D);
  local_288 = (int)*in_RCX;
  iStack_284 = (int)((ulong)*in_RCX >> 0x20);
  iStack_280 = (int)in_RCX[1];
  iStack_27c = (int)((ulong)in_RCX[1] >> 0x20);
  auVar31 = ZEXT416(in_R8D);
  auVar22._4_4_ = (iStack_b4 + iStack_c4) - iStack_244 >> auVar29;
  auVar22._0_4_ = (iVar17 + iVar13) - local_248 >> auVar29;
  auVar22._12_4_ = (iStack_ac + iStack_bc) - iStack_23c >> auVar29;
  auVar22._8_4_ = (iVar18 + iVar14) - iStack_240 >> auVar29;
  auVar21._4_4_ = (iStack_94 + iStack_a4) - iStack_224 >> auVar28;
  auVar21._0_4_ = (iVar19 + iVar15) - local_228 >> auVar28;
  auVar21._12_4_ = (iStack_8c + iStack_9c) - iStack_21c >> auVar28;
  auVar21._8_4_ = (iVar20 + iVar16) - iStack_220 >> auVar28;
  packssdw(auVar22,auVar21);
  auVar29._4_4_ = (iStack_f4 + iStack_104) - iStack_284 >> auVar31;
  auVar29._0_4_ = (iVar9 + iVar5) - local_288 >> auVar31;
  auVar29._12_4_ = (iStack_ec + iStack_fc) - iStack_27c >> auVar31;
  auVar29._8_4_ = (iVar10 + iVar6) - iStack_280 >> auVar31;
  auVar28._4_4_ = (iStack_d4 + iStack_e4) - iStack_264 >> auVar30;
  auVar28._0_4_ = (iVar11 + iVar7) - local_268 >> auVar30;
  auVar28._12_4_ = (iStack_cc + iStack_dc) - iStack_25c >> auVar30;
  auVar28._8_4_ = (iVar12 + iVar8) - iStack_260 >> auVar30;
  packssdw(auVar29,auVar28);
  alVar32[0] = (longlong)pvVar27;
  xx_storeu_128(in_RDI,alVar32);
  v[1] = extraout_RDX;
  v[0] = (longlong)pvVar27;
  xx_storeu_128((void *)((long)in_RDI + 0x10),v);
  return;
}

Assistant:

static inline void highbd_blend_a64_d16_mask_w16_sse4_1(
    uint16_t *dst, const CONV_BUF_TYPE *src0, const CONV_BUF_TYPE *src1,
    const __m128i *round_offset, int shift, const __m128i *mask0l,
    const __m128i *mask0h, const __m128i *clip_low, const __m128i *clip_high,
    const __m128i *mask_max) {
  // Load 16x u16 pixels for this row from each src
  const __m128i s0l = xx_loadu_128(src0);
  const __m128i s0h = xx_loadu_128(src0 + 8);
  const __m128i s1l = xx_loadu_128(src1);
  const __m128i s1h = xx_loadu_128(src1 + 8);

  // Calculate inverse masks
  const __m128i mask1h = _mm_sub_epi16(*mask_max, *mask0h);
  const __m128i mask1l = _mm_sub_epi16(*mask_max, *mask0l);

  const __m128i mul0_highs = _mm_mulhi_epu16(*mask0h, s0h);
  const __m128i mul0_lows = _mm_mullo_epi16(*mask0h, s0h);
  const __m128i mul0h = _mm_unpackhi_epi16(mul0_lows, mul0_highs);
  const __m128i mul0l = _mm_unpacklo_epi16(mul0_lows, mul0_highs);

  const __m128i mul1_highs = _mm_mulhi_epu16(mask1h, s1h);
  const __m128i mul1_lows = _mm_mullo_epi16(mask1h, s1h);
  const __m128i mul1h = _mm_unpackhi_epi16(mul1_lows, mul1_highs);
  const __m128i mul1l = _mm_unpacklo_epi16(mul1_lows, mul1_highs);

  const __m128i mulhh = _mm_add_epi32(mul0h, mul1h);
  const __m128i mulhl = _mm_add_epi32(mul0l, mul1l);

  const __m128i mul2_highs = _mm_mulhi_epu16(*mask0l, s0l);
  const __m128i mul2_lows = _mm_mullo_epi16(*mask0l, s0l);
  const __m128i mul2h = _mm_unpackhi_epi16(mul2_lows, mul2_highs);
  const __m128i mul2l = _mm_unpacklo_epi16(mul2_lows, mul2_highs);

  const __m128i mul3_highs = _mm_mulhi_epu16(mask1l, s1l);
  const __m128i mul3_lows = _mm_mullo_epi16(mask1l, s1l);
  const __m128i mul3h = _mm_unpackhi_epi16(mul3_lows, mul3_highs);
  const __m128i mul3l = _mm_unpacklo_epi16(mul3_lows, mul3_highs);

  const __m128i mullh = _mm_add_epi32(mul2h, mul3h);
  const __m128i mulll = _mm_add_epi32(mul2l, mul3l);

  const __m128i reshh =
      _mm_srai_epi32(_mm_sub_epi32(mulhh, *round_offset), shift);
  const __m128i reshl =
      _mm_srai_epi32(_mm_sub_epi32(mulhl, *round_offset), shift);
  const __m128i reslh =
      _mm_srai_epi32(_mm_sub_epi32(mullh, *round_offset), shift);
  const __m128i resll =
      _mm_srai_epi32(_mm_sub_epi32(mulll, *round_offset), shift);

  // Signed saturating pack from i32 to i16:
  const __m128i packh = _mm_packs_epi32(reshl, reshh);
  const __m128i packl = _mm_packs_epi32(resll, reslh);

  // Clip the values to the valid range
  const __m128i cliph =
      _mm_min_epi16(_mm_max_epi16(packh, *clip_low), *clip_high);
  const __m128i clipl =
      _mm_min_epi16(_mm_max_epi16(packl, *clip_low), *clip_high);

  // Store 16 pixels
  xx_storeu_128(dst, clipl);
  xx_storeu_128(dst + 8, cliph);
}